

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_function_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  long lVar2;
  JSValueUnion JVar3;
  bool bVar4;
  int iVar5;
  JSRefCountHeader *p;
  uint uVar6;
  char *str1;
  JSValue JVar7;
  
  iVar5 = check_function(ctx,this_val);
  if (iVar5 == 0) {
    uVar1 = *(ushort *)((long)this_val.u.ptr + 6);
    uVar6 = 0;
    if (((ulong)uVar1 < 0x32) && (uVar6 = 0, (0x2200000012000U >> ((ulong)uVar1 & 0x3f) & 1) != 0))
    {
      lVar2 = *(long *)((long)this_val.u.ptr + 0x30);
      if (((*(ushort *)(lVar2 + 0x19) >> 10 & 1) == 0) || (*(char **)(lVar2 + 0x78) == (char *)0x0))
      {
        uVar6 = *(ushort *)(lVar2 + 0x19) >> 4 & 3;
        bVar4 = true;
        JVar7 = (JSValue)(ZEXT216(uVar1) << 0x40);
      }
      else {
        JVar7 = JS_NewStringLen(ctx,*(char **)(lVar2 + 0x78),(long)*(int *)(lVar2 + 0x68));
        bVar4 = false;
        uVar6 = 0;
      }
      if (!bVar4) {
        return JVar7;
      }
    }
    if (uVar6 - 1 < 3) {
      str1 = &DAT_0017dd1c + *(int *)(&DAT_0017dd1c + (ulong)(uVar6 - 1) * 4);
    }
    else {
      str1 = "function ";
    }
    JVar7 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
    if ((int)JVar7.tag == 3) {
      JVar3 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
      JVar7.tag = -7;
      JVar7.u.ptr = JVar3.ptr;
    }
    JVar7 = JS_ConcatString3(ctx,str1,JVar7,"() {\n    [native code]\n}");
  }
  else {
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar7;
}

Assistant:

static JSValue js_function_toString(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionKindEnum func_kind = JS_FUNC_NORMAL;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(this_val);
    if (js_class_has_bytecode(p->class_id)) {
        JSFunctionBytecode *b = p->u.func.function_bytecode;
        if (b->has_debug && b->debug.source) {
            return JS_NewStringLen(ctx, b->debug.source, b->debug.source_len);
        }
        func_kind = b->func_kind;
    }
    {
        JSValue name;
        const char *pref, *suff;

        switch(func_kind) {
        default:
        case JS_FUNC_NORMAL:
            pref = "function ";
            break;
        case JS_FUNC_GENERATOR:
            pref = "function *";
            break;
        case JS_FUNC_ASYNC:
            pref = "async function ";
            break;
        case JS_FUNC_ASYNC_GENERATOR:
            pref = "async function *";
            break;
        }
        suff = "() {\n    [native code]\n}";
        name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
        if (JS_IsUndefined(name))
            name = JS_AtomToString(ctx, JS_ATOM_empty_string);
        return JS_ConcatString3(ctx, pref, name, suff);
    }
}